

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<long>::SolveEigensystemJacobi
          (TPZMatrix<long> *this,int64_t *numiterations,REAL *tol,TPZVec<long> *Eigenvalues,
          TPZFMatrix<long> *Eigenvectors)

{
  double dVar1;
  long lVar2;
  ulong row;
  long lVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  long lVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  int64_t j;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int64_t i;
  double dVar12;
  double local_438;
  long local_3f8;
  TPZFNMatrix<9,_long> Matrix_1;
  TPZFNMatrix<3,_long> VecIni_cp;
  TPZFNMatrix<3,_long> VecIni;
  TPZFMatrix<long> local_1a0;
  TPZFNMatrix<9,_long> Matrix;
  
  lVar2 = *numiterations;
  dVar1 = *tol;
  row = (this->super_TPZBaseMatrix).fRow;
  TPZFNMatrix<9,_long>::TPZFNMatrix(&Matrix,row,row);
  uVar10 = 0;
  uVar11 = 0;
  if (0 < (long)row) {
    uVar11 = row;
  }
  for (; uVar10 != uVar11; uVar10 = uVar10 + 1) {
    for (uVar9 = 0; row != uVar9; uVar9 = uVar9 + 1) {
      iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                        (this,uVar10,uVar9);
      plVar6 = TPZFMatrix<long>::operator()(&Matrix.super_TPZFMatrix<long>,uVar10,uVar9);
      *plVar6 = CONCAT44(extraout_var,iVar5);
    }
  }
  bVar4 = SolveEigenvaluesJacobi((TPZMatrix<long> *)&Matrix,numiterations,tol,Eigenvalues);
  if (bVar4) {
    Matrix_1.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<3,_long>::TPZFNMatrix(&VecIni,row,1,(long *)&Matrix_1);
    Matrix_1.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<3,_long>::TPZFNMatrix(&VecIni_cp,row,1,(long *)&Matrix_1);
    (*(Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(Eigenvectors,row,row);
    (*(Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(Eigenvectors);
    for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
      for (uVar9 = 0; row != uVar9; uVar9 = uVar9 + 1) {
        iVar5 = rand();
        VecIni.super_TPZFMatrix<long>.fElem[uVar9] = (long)iVar5;
      }
      TPZFMatrix<long>::TPZFMatrix(&local_1a0,this);
      TPZFNMatrix<9,_long>::TPZFNMatrix(&Matrix_1,&local_1a0);
      TPZFMatrix<long>::~TPZFMatrix(&local_1a0);
      lVar7 = ReturnNearestValue(Eigenvalues->fStore[uVar10],Eigenvalues,0);
      dVar12 = ABS((double)(lVar7 - Eigenvalues->fStore[uVar10]));
      if (dVar12 <= 1e-05) {
        for (uVar9 = 0; row != uVar9; uVar9 = uVar9 + 1) {
          iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,uVar9,uVar9);
          Matrix_1.super_TPZFMatrix<long>.fElem
          [(uVar9 & 0xffffffff) *
           Matrix_1.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow + uVar9] =
               CONCAT44(extraout_var_01,iVar5) - Eigenvalues->fStore[uVar10];
        }
      }
      else {
        for (uVar9 = 0; row != uVar9; uVar9 = uVar9 + 1) {
          iVar5 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,uVar9,uVar9);
          Matrix_1.super_TPZFMatrix<long>.fElem
          [(uVar9 & 0xffffffff) *
           Matrix_1.super_TPZFMatrix<long>.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow + uVar9] =
               (CONCAT44(extraout_var_00,iVar5) + (long)(dVar12 * 0.01)) -
               Eigenvalues->fStore[uVar10];
        }
      }
      local_438 = 0.0;
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
        lVar7 = *plVar6;
        plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
        local_438 = local_438 + ABS((double)*plVar6) * ABS((double)lVar7);
      }
      if (local_438 < 0.0) {
        local_438 = sqrt(local_438);
      }
      else {
        local_438 = SQRT(local_438);
      }
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
        lVar7 = *plVar6;
        plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
        *plVar6 = lVar7 / (long)local_438;
      }
      local_438 = 10.0;
      for (local_3f8 = 0; (dVar1 < local_438 && (local_3f8 <= lVar2)); local_3f8 = local_3f8 + 1) {
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
          lVar7 = *plVar6;
          plVar6 = TPZFMatrix<long>::operator()(&VecIni_cp.super_TPZFMatrix<long>,uVar9,0);
          *plVar6 = lVar7;
        }
        Solve_LU((TPZMatrix<long> *)&Matrix_1,&VecIni.super_TPZFMatrix<long>);
        local_438 = 0.0;
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
          lVar7 = *plVar6;
          plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
          local_438 = local_438 + ABS((double)*plVar6) * ABS((double)lVar7);
        }
        if (local_438 < 0.0) {
          dVar12 = sqrt(local_438);
        }
        else {
          dVar12 = SQRT(local_438);
        }
        local_438 = 0.0;
        for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
          plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
          lVar7 = *plVar6;
          plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
          *plVar6 = lVar7 / (long)dVar12;
          plVar6 = TPZFMatrix<long>::operator()(&VecIni_cp.super_TPZFMatrix<long>,uVar9,0);
          lVar7 = *plVar6;
          plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
          lVar8 = *plVar6;
          plVar6 = TPZFMatrix<long>::operator()(&VecIni_cp.super_TPZFMatrix<long>,uVar9,0);
          lVar3 = *plVar6;
          plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
          local_438 = local_438 + ABS((double)((lVar3 - *plVar6) * (lVar7 - lVar8)));
        }
        if (local_438 < 0.0) {
          local_438 = sqrt(local_438);
        }
        else {
          local_438 = SQRT(local_438);
        }
      }
      for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
        plVar6 = TPZFMatrix<long>::operator()(&VecIni.super_TPZFMatrix<long>,uVar9,0);
        lVar7 = *plVar6;
        plVar6 = TPZFMatrix<long>::operator()(Eigenvectors,uVar10,uVar9);
        lVar8 = 0;
        if (1e-05 <= ABS((double)lVar7)) {
          lVar8 = lVar7;
        }
        *plVar6 = lVar8;
      }
      TPZFNMatrix<9,_long>::~TPZFNMatrix(&Matrix_1);
    }
    TPZFNMatrix<3,_long>::~TPZFNMatrix(&VecIni_cp);
    TPZFNMatrix<3,_long>::~TPZFNMatrix(&VecIni);
  }
  TPZFNMatrix<9,_long>::~TPZFNMatrix(&Matrix);
  return bVar4;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}